

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_> * __thiscall
CTxMemPool::GetPrioritisedTransactions
          (vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>
           *__return_storage_ptr__,CTxMemPool *this)

{
  iterator __position;
  iterator iVar1;
  _Base_ptr p_Var2;
  _Storage<long,_true> unaff_R13;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  unique_lock<std::recursive_mutex> local_88;
  undefined1 local_78 [48];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_device = &(this->cs).super_recursive_mutex;
  local_88._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_88);
  (__return_storage_ptr__->
  super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>::reserve
            (__return_storage_ptr__,
             (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var2 = (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      iVar1 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
              ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                        ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                          *)&(this->mapTx).super_type,p_Var2 + 1,&(this->mapTx).super_type.hash_,
                         &(this->mapTx).super_type.field_0x68);
      local_78[0] = iVar1.node !=
                    (this->mapTx).
                    super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                    .member;
      if (local_78[0]) {
        unaff_R13 = *(_Storage<long,_true> *)
                     ((long)&((iVar1.node)->
                             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                             .
                             super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                             .super_pod_value_holder<CTxMemPoolEntry>.space + 0xa8);
      }
      local_78._8_8_ = *(undefined8 *)(p_Var2 + 2);
      local_78._32_8_ = *(undefined8 *)(p_Var2 + 1);
      local_78._40_8_ = p_Var2[1]._M_parent;
      local_48 = p_Var2[1]._M_left;
      p_Stack_40 = p_Var2[1]._M_right;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_78._16_8_ = unaff_R13;
      local_78[0x18] = local_78[0];
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>::
        _M_realloc_insert<CTxMemPool::delta_info>
                  (__return_storage_ptr__,__position,(delta_info *)local_78);
      }
      else {
        *(_Base_ptr *)(((__position._M_current)->txid).super_base_blob<256U>.m_data._M_elems + 0x10)
             = local_48;
        *(_Base_ptr *)(((__position._M_current)->txid).super_base_blob<256U>.m_data._M_elems + 0x18)
             = p_Stack_40;
        *(undefined8 *)((__position._M_current)->txid).super_base_blob<256U>.m_data._M_elems =
             local_78._32_8_;
        *(undefined8 *)(((__position._M_current)->txid).super_base_blob<256U>.m_data._M_elems + 8) =
             local_78._40_8_;
        ((__position._M_current)->modified_fee).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = unaff_R13;
        *(ulong *)&((__position._M_current)->modified_fee).super__Optional_base<long,_true,_true>.
                   _M_payload.super__Optional_payload_base<long>._M_engaged =
             CONCAT71(local_78._25_7_,local_78[0]);
        *(ulong *)__position._M_current = CONCAT71(local_78._1_7_,local_78[0]);
        (__position._M_current)->delta = local_78._8_8_;
        (__return_storage_ptr__->
        super__Vector_base<CTxMemPool::delta_info,_std::allocator<CTxMemPool::delta_info>_>)._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CTxMemPool::delta_info> CTxMemPool::GetPrioritisedTransactions() const
{
    AssertLockNotHeld(cs);
    LOCK(cs);
    std::vector<delta_info> result;
    result.reserve(mapDeltas.size());
    for (const auto& [txid, delta] : mapDeltas) {
        const auto iter{mapTx.find(txid)};
        const bool in_mempool{iter != mapTx.end()};
        std::optional<CAmount> modified_fee;
        if (in_mempool) modified_fee = iter->GetModifiedFee();
        result.emplace_back(delta_info{in_mempool, delta, modified_fee, txid});
    }
    return result;
}